

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_matrix_norm.c
# Opt level: O0

void __thiscall lu_matrix_norm(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double colsum;
  double infnorm;
  double onenorm;
  lu_int pos;
  lu_int k;
  lu_int i;
  lu_int jpivot;
  lu_int ipivot;
  double *rowsum;
  lu_int *pivotrow;
  lu_int *pivotcol;
  lu_int rank;
  lu_int m;
  double *Bx_local;
  lu_int *Bi_local;
  lu_int *Bend_local;
  lu_int *Bbegin_local;
  lu *this_local;
  
  iVar2 = *(int *)((long)this + 0x54);
  iVar3 = *(int *)((long)this + 0x13c);
  lVar7 = *(long *)((long)this + 0x1d8);
  lVar5 = *(long *)((long)this + 0x1e8);
  lVar6 = *(long *)((long)this + 0x2a0);
  for (i = 0; i < iVar2; i = i + 1) {
    *(undefined8 *)(lVar6 + (long)i * 8) = 0;
  }
  onenorm = 0.0;
  infnorm = 0.0;
  for (k = 0; k < iVar3; k = k + 1) {
    iVar4 = *(int *)(lVar7 + (long)k * 4);
    colsum = 0.0;
    for (pos = Bbegin[iVar4]; pos < Bend[iVar4]; pos = pos + 1) {
      colsum = ABS(Bx[pos]) + colsum;
      *(double *)(lVar6 + (long)Bi[pos] * 8) = ABS(Bx[pos]) + *(double *)(lVar6 + (long)Bi[pos] * 8)
      ;
    }
    uVar8 = SUB84(colsum,0);
    uVar9 = (int)((ulong)colsum >> 0x20);
    if (colsum <= onenorm) {
      uVar8 = SUB84(onenorm,0);
      uVar9 = (int)((ulong)onenorm >> 0x20);
    }
    onenorm = (double)(~-(ulong)NAN(onenorm) & CONCAT44(uVar9,uVar8) |
                      -(ulong)NAN(onenorm) & (ulong)colsum);
  }
  while (k = iVar3, k < iVar2) {
    lVar7 = (long)*(int *)(lVar5 + (long)k * 4);
    *(double *)(lVar6 + lVar7 * 8) = *(double *)(lVar6 + lVar7 * 8) + 1.0;
    if (onenorm <= 1.0) {
      onenorm = 1.0;
    }
    iVar3 = k + 1;
  }
  for (i = 0; i < iVar2; i = i + 1) {
    dVar1 = *(double *)(lVar6 + (long)i * 8);
    uVar8 = SUB84(dVar1,0);
    uVar9 = (int)((ulong)dVar1 >> 0x20);
    if (dVar1 <= infnorm) {
      uVar8 = SUB84(infnorm,0);
      uVar9 = (int)((ulong)infnorm >> 0x20);
    }
    infnorm = (double)(~-(ulong)NAN(infnorm) & CONCAT44(uVar9,uVar8) |
                      -(ulong)NAN(infnorm) & (ulong)dVar1);
  }
  *(double *)((long)this + 0x120) = onenorm;
  *(double *)((long)this + 0x128) = infnorm;
  return;
}

Assistant:

void lu_matrix_norm(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m          = this->m;
    const lu_int rank       = this->rank;
    const lu_int *pivotcol  = this->pivotcol;
    const lu_int *pivotrow  = this->pivotrow;
    double *rowsum          = this->work1;
    lu_int ipivot, jpivot, i, k, pos;
    double onenorm, infnorm, colsum;

    assert(this->nupdate == 0);

    for (i = 0; i < m; i++) rowsum[i] = 0;
    onenorm = 0;
    infnorm = 0;
    for (k = 0; k < rank; k++)
    {
        jpivot = pivotcol[k];
        colsum = 0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            colsum += fabs(Bx[pos]);
            rowsum[Bi[pos]] += fabs(Bx[pos]);
        }
        onenorm = fmax(onenorm, colsum);
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rowsum[ipivot] += 1;
        onenorm = fmax(onenorm, 1);
    }
    for (i = 0; i < m; i++) infnorm = fmax(infnorm, rowsum[i]);

    this->onenorm = onenorm;
    this->infnorm = infnorm;
}